

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O3

void * rw::rasterOpen(void *object,int32 offset,int32 size)

{
  long lVar1;
  long lVar2;
  
  rasterModuleOffset = offset;
  *(undefined4 *)(engine + offset) = 0xffffffff;
  lVar1 = (long)rasterModuleOffset;
  lVar2 = 0;
  do {
    *(undefined8 *)(engine + lVar1 + 8 + lVar2 * 8) = 0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  return object;
}

Assistant:

static void*
rasterOpen(void *object, int32 offset, int32 size)
{
	int i;
	rasterModuleOffset = offset;
	RASTERGLOBAL(sp) = -1;
	for(i = 0; i < (int)nelem(RASTERGLOBAL(stack)); i++)
		RASTERGLOBAL(stack)[i] = nil;
	return object;
}